

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O0

void __thiscall QAnimationGroupPrivate::clear(QAnimationGroupPrivate *this,bool onDestruction)

{
  QAbstractAnimation *pQVar1;
  const_reference ppQVar2;
  QAbstractAnimationPrivate *pQVar3;
  byte in_SIL;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractAnimation *animation;
  qsizetype i;
  QList<QAbstractAnimation_*> animationsCopy;
  QObject *in_stack_ffffffffffffff78;
  QObject *in_stack_ffffffffffffff80;
  long local_50;
  QList<QAbstractAnimation_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QAbstractAnimation **)&DAT_aaaaaaaaaaaaaaaa;
  QList<QAbstractAnimation_*>::QList
            ((QList<QAbstractAnimation_*> *)in_stack_ffffffffffffff80,
             (QList<QAbstractAnimation_*> *)in_stack_ffffffffffffff78);
  QList<QAbstractAnimation_*>::clear((QList<QAbstractAnimation_*> *)in_stack_ffffffffffffff80);
  local_50 = QList<QAbstractAnimation_*>::size(&local_28);
  while (local_50 = local_50 + -1, -1 < local_50) {
    ppQVar2 = QList<QAbstractAnimation_*>::at
                        ((QList<QAbstractAnimation_*> *)in_stack_ffffffffffffff80,
                         (qsizetype)in_stack_ffffffffffffff78);
    pQVar1 = *ppQVar2;
    QObject::setParent(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pQVar3 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x67b651);
    pQVar3->group = (QAnimationGroup *)0x0;
    if ((in_SIL & 1) == 0) {
      (**(code **)(*in_RDI + 0x28))(in_RDI,local_50,pQVar1);
    }
    if (pQVar1 != (QAbstractAnimation *)0x0) {
      (*(pQVar1->super_QObject)._vptr_QObject[4])();
    }
  }
  QList<QAbstractAnimation_*>::~QList((QList<QAbstractAnimation_*> *)0x67b6e3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAnimationGroupPrivate::clear(bool onDestruction)
{
    const QList<QAbstractAnimation *> animationsCopy = animations; // taking a copy
    animations.clear();
    // Clearing backwards so the indices doesn't change while we remove animations.
    for (qsizetype i = animationsCopy.size() - 1; i >= 0; --i) {
        QAbstractAnimation *animation = animationsCopy.at(i);
        animation->setParent(nullptr);
        QAbstractAnimationPrivate::get(animation)->group = nullptr;
        // If we are in ~QAnimationGroup() it is not safe to called the virtual
        // animationRemoved method, which can still be a method in a
        // QAnimationGroupPrivate derived class that assumes q_ptr is still
        // a valid derived class of QAnimationGroup.
        if (!onDestruction)
            animationRemoved(i, animation);
        delete animation;
    }
}